

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O3

bool __thiscall
V4L2Device::compress_jpeg(V4L2Device *this,RawImagePtr *image,string *jpeg_file_name)

{
  char **ppcVar1;
  uint uVar2;
  RawImage *pRVar3;
  element_type *peVar4;
  Options *this_00;
  FILE *__stream;
  const_iterator cVar5;
  Writer *pWVar6;
  size_t sVar7;
  OptionDetails *this_01;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  undefined1 *puVar11;
  bool bVar12;
  JSAMPROW row_pointer [1];
  jpeg_error_mgr jerr;
  long local_398;
  Writer local_390;
  undefined8 local_320 [6];
  undefined8 local_2f0;
  undefined8 local_2e8;
  uint local_1cc;
  undefined1 local_d8 [168];
  
  local_320[0] = jpeg_std_error(local_d8);
  jpeg_CreateCompress(local_320,0x50,0x248);
  __stream = fopen((jpeg_file_name->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    local_390._vptr_Writer = (_func_int **)&PTR__Writer_00162088;
    local_390.m_level = Error;
    local_390.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_390.m_line = 0x239;
    local_390.m_func = "bool V4L2Device::compress_jpeg(const RawImagePtr &, const std::string &)";
    local_390.m_verboseLevel = 0;
    local_390.m_logger = (Logger *)0x0;
    local_390.m_proceed = false;
    local_390.m_messageBuilder.m_logger = (Logger *)0x0;
    local_390.m_messageBuilder.m_containerLogSeperator = "";
    local_390.m_dispatchAction = NormalLog;
    local_390.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_390.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_390.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar6 = el::base::Writer::construct(&local_390,1,"default");
    if (pWVar6->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50,"can\'t open \'",0xc)
      ;
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if (pWVar6->m_proceed == true) {
      pcVar9 = (jpeg_file_name->_M_dataplus)._M_p;
      puVar11 = &((pWVar6->m_messageBuilder).m_logger)->field_0x50;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)puVar11 + (int)*(undefined8 *)(*(long *)puVar11 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar11,pcVar9,sVar7);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if (pWVar6->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50,"\': ",3);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    if (pWVar6->m_proceed == true) {
      puVar11 = &((pWVar6->m_messageBuilder).m_logger)->field_0x50;
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)puVar11 + (int)*(undefined8 *)(*(long *)puVar11 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar11,pcVar9,sVar7);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar6->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer(&local_390);
  }
  else {
    jpeg_stdio_dest(local_320,__stream);
    pRVar3 = (image->_M_t).
             super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
             ._M_t.
             super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
             .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl;
    local_2f0._0_4_ = pRVar3->width;
    local_2f0._4_4_ = pRVar3->height;
    local_2e8 = 0x200000003;
    jpeg_set_defaults(local_320);
    peVar4 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    ppcVar1 = &local_390.m_file;
    local_390._vptr_Writer = (_func_int **)ppcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"quality","");
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
            ::find(&(peVar4->m_options)._M_t,(key_type *)&local_390);
    if ((_Rb_tree_header *)cVar5._M_node == &(peVar4->m_options)._M_t._M_impl.super__Rb_tree_header)
    {
      bVar12 = true;
    }
    else {
      bVar12 = *(int *)(*(long *)(cVar5._M_node + 2) + 0x30) == 0;
    }
    if (local_390._vptr_Writer != (_func_int **)ppcVar1) {
      operator_delete(local_390._vptr_Writer);
    }
    iVar10 = 0x4b;
    if (!bVar12) {
      this_00 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      local_390._vptr_Writer = (_func_int **)ppcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"quality","");
      this_01 = cxxopts::Options::operator[](this_00,(string *)&local_390);
      piVar8 = cxxopts::OptionDetails::as<int>(this_01);
      iVar10 = *piVar8;
      if (local_390._vptr_Writer != (_func_int **)ppcVar1) {
        operator_delete(local_390._vptr_Writer);
      }
    }
    jpeg_set_quality(local_320,iVar10,1);
    jpeg_start_compress(local_320,1);
    if (local_1cc < local_2f0._4_4_) {
      uVar2 = ((image->_M_t).
               super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
               ._M_t.
               super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
               .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl)->width;
      do {
        local_398 = (ulong)(local_1cc * uVar2 * 3) +
                    (long)(((image->_M_t).
                            super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
                            .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl)->
                          raw_data)._M_t;
        jpeg_write_scanlines(local_320,&local_398,1);
      } while (local_1cc < local_2f0._4_4_);
    }
    jpeg_finish_compress(local_320);
    fclose(__stream);
    jpeg_destroy_compress(local_320);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool
    compress_jpeg(const RawImagePtr& image, const std::string& jpeg_file_name)
    {
        struct jpeg_compress_struct cinfo;
        struct jpeg_error_mgr jerr;

        JSAMPROW row_pointer[1];

        cinfo.err = jpeg_std_error(&jerr);
        jpeg_create_compress(&cinfo);

        FILE* outfile = fopen(jpeg_file_name.c_str(), "wb");
        if (outfile == nullptr) {
            LOG(ERROR) << "can't open '" << jpeg_file_name << "': " << strerror(errno);
            return false;
        }

        jpeg_stdio_dest(&cinfo, outfile);

        cinfo.image_width = image->width; /* image width and height, in pixels */
        cinfo.image_height = image->height;
        cinfo.input_components = 3; /* # of color components per pixel */
        cinfo.in_color_space = JCS_RGB; /* colorspace of input image */

        jpeg_set_defaults(&cinfo);

        int quality = kDefaultJPEGQuality;
        if (options->count("quality")) {
            quality = (*options)["quality"].as<int>();
        }

        jpeg_set_quality(&cinfo, quality, TRUE /* limit to baseline-JPEG values */);
        jpeg_start_compress(&cinfo, TRUE);

        auto row_stride = image->width * 3; /* JSAMPLEs per row in image_buffer */
        while (cinfo.next_scanline < cinfo.image_height) {
            row_pointer[0] = &(image->raw_data.get()[cinfo.next_scanline * row_stride]);
            jpeg_write_scanlines(&cinfo, row_pointer, 1);
        }

        jpeg_finish_compress(&cinfo);
        fclose(outfile);
        jpeg_destroy_compress(&cinfo);

        return true;
    }